

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O3

void benchmark(char *comment,Mat *_in,Option *opt)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  DataReaderFromEmpty dr;
  Extractor ex;
  Net net;
  char parampath [256];
  double local_2a8;
  double local_298;
  double local_290;
  DataReader local_288;
  double local_280;
  Mat local_278;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  Extractor local_1f0;
  Net local_1a8;
  char local_138 [264];
  
  local_278.data = _in->data;
  local_278.refcount = _in->refcount;
  local_278.elemsize = _in->elemsize;
  local_278.elempack = _in->elempack;
  local_278.allocator = _in->allocator;
  local_278.dims = _in->dims;
  local_278.w = _in->w;
  local_278.h = _in->h;
  local_278.c = _in->c;
  local_278.cstep = _in->cstep;
  iVar8 = _in->c;
  if (local_278.refcount != (int *)0x0) {
    LOCK();
    *local_278.refcount = *local_278.refcount + 1;
    UNLOCK();
    iVar8 = local_278.c;
  }
  auVar4 = _DAT_0016d030;
  auVar3 = _DAT_0016d020;
  auVar2 = _DAT_0016d010;
  uVar5 = (int)local_278.cstep * iVar8;
  if (0 < (int)uVar5) {
    lVar6 = (ulong)uVar5 - 1;
    auVar11._8_4_ = (int)lVar6;
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_0016d030;
    do {
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar8 = auVar11._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar8 && auVar11._0_4_ < auVar13._0_4_ || iVar8 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)((long)local_278.data + uVar7 * 4) = 0x3c23d70a;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        *(undefined4 *)((long)local_278.data + uVar7 * 4 + 4) = 0x3c23d70a;
      }
      auVar12 = (auVar12 | auVar2) ^ auVar4;
      iVar14 = auVar12._4_4_;
      if (iVar14 <= iVar8 && (iVar14 != iVar8 || auVar12._0_4_ <= auVar11._0_4_)) {
        *(undefined4 *)((long)local_278.data + uVar7 * 4 + 8) = 0x3c23d70a;
        *(undefined4 *)((long)local_278.data + uVar7 * 4 + 0xc) = 0x3c23d70a;
      }
      uVar7 = uVar7 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar7);
  }
  ncnn::Net::Net(&local_1a8);
  local_1a8.opt.use_int8_arithmetic = opt->use_int8_arithmetic;
  local_1a8.opt.use_packing_layout = opt->use_packing_layout;
  local_1a8.opt.lightmode = opt->lightmode;
  local_1a8.opt._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_1a8.opt.num_threads = opt->num_threads;
  local_1a8.opt.blob_allocator = opt->blob_allocator;
  local_1a8.opt.workspace_allocator = opt->workspace_allocator;
  local_1a8.opt.use_winograd_convolution = opt->use_winograd_convolution;
  local_1a8.opt.use_sgemm_convolution = opt->use_sgemm_convolution;
  local_1a8.opt.use_int8_inference = opt->use_int8_inference;
  local_1a8.opt.use_vulkan_compute = opt->use_vulkan_compute;
  local_1a8.opt.use_fp16_packed = opt->use_fp16_packed;
  local_1a8.opt.use_fp16_storage = opt->use_fp16_storage;
  local_1a8.opt.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  local_1a8.opt.use_int8_storage = opt->use_int8_storage;
  sprintf(local_138,"%s.param",comment);
  ncnn::Net::load_param(&local_1a8,local_138);
  local_288._vptr_DataReader = (_func_int **)&PTR__DataReader_00184700;
  ncnn::Net::load_model(&local_1a8,&local_288);
  ncnn::UnlockedPoolAllocator::clear(&g_blob_pool_allocator);
  ncnn::PoolAllocator::clear(&g_workspace_pool_allocator);
  sleep(10);
  local_238._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_238._0_8_ = (void *)0x0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  iVar8 = 8;
  do {
    ncnn::Net::create_extractor(&local_1f0,&local_1a8);
    ncnn::Extractor::input(&local_1f0,"data",&local_278);
    ncnn::Extractor::extract(&local_1f0,"output",(Mat *)local_238);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_1f0.blob_mats);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  if (g_loop_count < 1) {
    local_2a8 = 0.0;
    dVar10 = 1.79769313486232e+308;
    dVar9 = -1.79769313486232e+308;
  }
  else {
    local_290 = -1.79769313486232e+308;
    local_298 = 1.79769313486232e+308;
    local_2a8 = 0.0;
    iVar8 = 0;
    do {
      local_280 = ncnn::get_current_time();
      ncnn::Net::create_extractor(&local_1f0,&local_1a8);
      ncnn::Extractor::input(&local_1f0,"data",&local_278);
      ncnn::Extractor::extract(&local_1f0,"output",(Mat *)local_238);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_1f0.blob_mats);
      dVar9 = ncnn::get_current_time();
      dVar9 = dVar9 - local_280;
      dVar10 = dVar9;
      if (local_298 <= dVar9) {
        dVar10 = local_298;
      }
      local_2a8 = local_2a8 + dVar9;
      if (dVar9 <= local_290) {
        dVar9 = local_290;
      }
      iVar8 = iVar8 + 1;
      local_298 = dVar10;
      local_290 = dVar9;
    } while (iVar8 < g_loop_count);
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",dVar10,dVar9,
          local_2a8 / (double)g_loop_count,comment);
  piVar1 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if ((Allocator *)local_218._0_8_ == (Allocator *)0x0) {
        if ((void *)local_238._0_8_ != (void *)0x0) {
          free((void *)local_238._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_218._0_8_)[3])();
      }
    }
  }
  ncnn::DataReader::~DataReader(&local_288);
  ncnn::Net::~Net(&local_1a8);
  if (local_278.refcount != (int *)0x0) {
    LOCK();
    *local_278.refcount = *local_278.refcount + -1;
    UNLOCK();
    if (*local_278.refcount == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if (local_278.data != (void *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

    char parampath[256];
    sprintf(parampath, "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
    Sleep(10 * 1000);
#else
    sleep(10);
#endif

    ncnn::Mat out;

    // warm up
    for (int i=0; i<g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input("data", in);
        ex.extract("output", out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i=0; i<g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input("data", in);
            ex.extract("output", out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}